

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall cmdline::parser::parse_check(parser *this,int argc,char **argv)

{
  int argc_00;
  bool ok;
  size_type sVar1;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  key_type local_40;
  char **local_20;
  char **argv_local;
  parser *ppStack_10;
  int argc_local;
  parser *this_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  ppStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"help",&local_41);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(&this->options,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (sVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"help",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"print this message",&local_a1);
    add(this,&local_78,'?',&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  argc_00 = argv_local._4_4_;
  ok = parse(this,argv_local._4_4_,local_20);
  check(this,argc_00,ok);
  return;
}

Assistant:

void parse_check(int argc, char *argv[]){
    if (!options.count("help"))
      add("help", '?', "print this message");
    check(argc, parse(argc, argv));
  }